

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shlut.hpp
# Opt level: O0

GLuint build_sh_lut(void)

{
  GLuint local_1c;
  float *pfStack_18;
  GLuint texture;
  float *data;
  int size;
  
  github111116::ConsoleLogger::log<char[19]>(&console,(char (*) [19])"building sh lut...");
  data._4_4_ = 0x80;
  pfStack_18 = (float *)operator_new__(0x5460000);
  calculate_sh_lut(pfStack_18,0x80);
  (*glad_glGenTextures)(1,&local_1c);
  (*glad_glActiveTexture)(0x84c3);
  (*glad_glBindTexture)(0x9009,local_1c);
  (*glad_glTexParameteri)(0x9009,0x2800,0x2601);
  (*glad_glTexParameteri)(0x9009,0x2801,0x2601);
  (*glad_glTexParameteri)(0x9009,0x8072,0x812f);
  (*glad_glTexParameteri)(0x9009,0x2802,0x812f);
  (*glad_glTexParameteri)(0x9009,0x2803,0x812f);
  (*glad_glTexImage3D)(0x9009,0,0x822e,0x80,0x80,0x546,0,0x1903,0x1406,pfStack_18);
  if (pfStack_18 != (float *)0x0) {
    operator_delete__(pfStack_18);
  }
  return local_1c;
}

Assistant:

GLuint build_sh_lut()
{
	console.log("building sh lut...");
	const int size = 128;
	float *data = new float[N_COEFFS*6*size*size];

	calculate_sh_lut(data, size);
	// create & bind a named texture
	GLuint texture;
	glGenTextures(1, &texture);
	glActiveTexture(GL_TEXTURE3);
	glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture);
	// set the texture wrapping/filtering options (on the currently bound texture object)
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	// generate the texture
	glTexImage3D( GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_R32F, size, size, N_COEFFS*6, 0, GL_RED, GL_FLOAT, data);

	delete [] data;
	return texture;
}